

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<LargeBlock<512,_128>_*,_false,_false>::grow_and_add
          (FastVector<LargeBlock<512,_128>_*,_false,_false> *this,uint newSize,
          LargeBlock<512,_128> **val)

{
  uint uVar1;
  uint uVar2;
  LargeBlock<512,_128> **ptr;
  LargeBlock<512,_128> *pLVar3;
  uint oldMax;
  LargeBlock<512,_128> **oldData;
  LargeBlock<512,_128> **val_local;
  uint newSize_local;
  FastVector<LargeBlock<512,_128>_*,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pLVar3 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = pLVar3;
  if (ptr != (LargeBlock<512,_128> **)0x0) {
    NULLC::destruct<LargeBlock<512,128>*>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}